

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O3

void __thiscall
QSharedDataPointer<QDnsTextRecordPrivate>::detach_helper
          (QSharedDataPointer<QDnsTextRecordPrivate> *this)

{
  QDnsTextRecordPrivate *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  QDnsTextRecordPrivate *pQVar4;
  
  pQVar4 = (QDnsTextRecordPrivate *)operator_new(0x40);
  pQVar1 = (this->d).ptr;
  (pQVar4->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value = (Type)0x0;
  pDVar2 = (pQVar1->super_QDnsRecordPrivate).name.d.d;
  (pQVar4->super_QDnsRecordPrivate).name.d.d = pDVar2;
  (pQVar4->super_QDnsRecordPrivate).name.d.ptr = (pQVar1->super_QDnsRecordPrivate).name.d.ptr;
  (pQVar4->super_QDnsRecordPrivate).name.d.size = (pQVar1->super_QDnsRecordPrivate).name.d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  (pQVar4->super_QDnsRecordPrivate).timeToLive = (pQVar1->super_QDnsRecordPrivate).timeToLive;
  pDVar3 = (pQVar1->values).d.d;
  (pQVar4->values).d.d = pDVar3;
  (pQVar4->values).d.ptr = (pQVar1->values).d.ptr;
  (pQVar4->values).d.size = (pQVar1->values).d.size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  LOCK();
  (pQVar4->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value =
       (Type)((int)(pQVar4->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>
                   .super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value =
       (Type)((int)(pQVar1->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>
                   .super_QBasicAtomicInteger<int>._q_value + -1);
  UNLOCK();
  if ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
    pQVar1 = (this->d).ptr;
    if (pQVar1 != (QDnsTextRecordPrivate *)0x0) {
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&(pQVar1->values).d);
      pDVar2 = (pQVar1->super_QDnsRecordPrivate).name.d.d;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
        UNLOCK();
        if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
          QArrayData::deallocate
                    (&((pQVar1->super_QDnsRecordPrivate).name.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    operator_delete(pQVar1,0x40);
  }
  (this->d).ptr = pQVar4;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}